

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BufferMapWriteCase::iterate(BufferMapWriteCase *this)

{
  RenderContext *renderCtx;
  deUint32 seed;
  deUint32 buffer;
  GLenum GVar1;
  deBool dVar2;
  uint uVar3;
  char *pcVar4;
  TestLog *log;
  deUint8 *pdVar5;
  TestError *this_00;
  bool isOk;
  void *ptr;
  deUint32 buf;
  BufferVerifier local_38;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  deUint32 dataSeed;
  BufferMapWriteCase *this_local;
  
  pcVar4 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar4);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)&verifier);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier(&local_38,renderCtx,log,this->m_verify);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)&verifier,this->m_size);
  pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar5,this->m_size,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,(long)this->m_size,
             (void *)0x0,this->m_usage);
  pdVar5 = (deUint8 *)
           glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,0,
                      (long)this->m_size,2);
  GVar1 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar1,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x86);
  while( true ) {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || (pdVar5 == (deUint8 *)0x0)) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar5,this->m_size,seed);
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget);
      GVar1 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar1,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0x8b);
      pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
      uVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                        (&local_38,(EVP_PKEY_CTX *)(ulong)buffer,pdVar5,0,
                         (uchar *)(ulong)(uint)this->m_size,(ulong)this->m_bufferTarget);
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
      pcVar4 = "Buffer verification failed";
      if ((uVar3 & 1) != 0) {
        pcVar4 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~((byte)uVar3 & 1) & QP_TEST_RESULT_FAIL,pcVar4);
      deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_38);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)&verifier);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x87);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed	= deStringHash(getName());
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verify);

		// Setup reference data.
		refBuf.setSize(m_size);
		fillWithRandomBytes(refBuf.getPtr(), m_size, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, m_size, DE_NULL, m_usage);

		void* ptr = glMapBufferRange(m_bufferTarget, 0, m_size, GL_MAP_WRITE_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		fillWithRandomBytes((deUint8*)ptr, m_size, dataSeed);
		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		bool isOk = verifier.verify(buf, refBuf.getPtr(), 0, m_size, m_bufferTarget);
		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}